

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall Highs::formStandardFormLp(Highs *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  iterator iVar6;
  int iVar7;
  long lVar8;
  int *__args;
  HighsInt iRow;
  iterator iVar9;
  ulong uVar10;
  long lVar11;
  HighsInt *pHVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  size_type __new_size;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double lower;
  uint local_3d4;
  HighsSparseMatrix *local_3d0;
  vector<double,std::allocator<double>> *local_3c8;
  HighsSparseMatrix *local_3c0;
  uint local_3b8;
  uint local_3b4;
  double upper;
  vector<int,_std::allocator<int>_> slack_ix;
  uint local_384;
  ulong local_378;
  ulong local_370;
  HighsSparseMatrix local_row;
  HighsSparseMatrix local_2d0;
  HighsSparseMatrix local_260;
  HighsSparseMatrix local_1f0;
  HighsSparseMatrix local_180;
  HighsSparseMatrix local_110;
  HighsSparseMatrix local_a0;
  
  clearStandardFormLp(this);
  local_3c0 = &(this->model_).lp_.a_matrix_;
  HighsSparseMatrix::ensureRowwise(local_3c0);
  dVar21 = (double)(this->model_).lp_.sense_;
  this->standard_form_offset_ = (this->model_).lp_.offset_ * dVar21;
  uVar14 = (this->model_).lp_.num_col_;
  if (0 < (int)uVar14) {
    lVar11 = 0;
    do {
      local_row._0_8_ =
           (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11] * dVar21;
      iVar9._M_current =
           (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->standard_form_cost_,iVar9,(double *)&local_row);
      }
      else {
        *iVar9._M_current = (double)local_row._0_8_;
        (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      lVar11 = lVar11 + 1;
      uVar14 = (this->model_).lp_.num_col_;
    } while (lVar11 < (int)uVar14);
  }
  (this->standard_form_matrix_).format_ = kRowwise;
  (this->standard_form_matrix_).num_col_ = uVar14;
  HighsSparseMatrix::HighsSparseMatrix(&local_row);
  HighsSparseMatrix::ensureRowwise(&local_row);
  __new_size = 2;
  if (2 < (int)uVar14) {
    __new_size = (size_type)uVar14;
  }
  local_row.num_row_ = 1;
  local_row.num_col_ = (this->model_).lp_.num_col_;
  std::vector<int,_std::allocator<int>_>::resize(&local_row.index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&local_row.value_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&local_row.start_,2);
  local_3d0 = &this->standard_form_matrix_;
  *local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = 0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((this->model_).lp_.num_row_ < 1) {
    uVar16 = 0;
    uVar15 = 0;
    uVar17 = 0;
    local_378 = 0;
    local_370 = 0;
  }
  else {
    pHVar12 = local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    local_3c8 = (vector<double,std::allocator<double>> *)&this->standard_form_rhs_;
    lVar11 = 0;
    local_370 = 0;
    local_378 = 0;
    uVar17 = 0;
    uVar15 = 0;
    uVar16 = 0;
    do {
      lower = (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      upper = (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      if ((-INFINITY < lower) || (upper < INFINITY)) {
        iRow = (HighsInt)lVar11;
        if ((lower != upper) || (NAN(lower) || NAN(upper))) {
          if (-INFINITY < lower) {
            if (upper < INFINITY) {
              local_3d4 = ~(uint)((ulong)((long)(this->standard_form_rhs_).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->standard_form_rhs_).
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3);
              if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&slack_ix,
                           (iterator)
                           slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_3d4);
              }
              else {
                *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3d4;
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              HighsSparseMatrix::getRow
                        (local_3c0,iRow,pHVar12,
                         local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_row.value_.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              local_1f0.num_row_ = local_row.num_row_;
              local_1f0.format_ = local_row.format_;
              local_1f0.num_col_ = local_row.num_col_;
              std::vector<int,_std::allocator<int>_>::vector(&local_1f0.start_,&local_row.start_);
              std::vector<int,_std::allocator<int>_>::vector(&local_1f0.p_end_,&local_row.p_end_);
              std::vector<int,_std::allocator<int>_>::vector(&local_1f0.index_,&local_row.index_);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_1f0.value_,&local_row.value_);
              HighsSparseMatrix::addRows(local_3d0,&local_1f0,(int8_t *)0x0);
              if (local_1f0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1f0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.index_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1f0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1f0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              iVar9._M_current =
                   (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_3c8,iVar9,&lower);
              }
              else {
                *iVar9._M_current = lower;
                (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
              }
              local_3d4 = (int)((ulong)((long)(this->standard_form_rhs_).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->standard_form_rhs_).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
              if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&slack_ix,
                           (iterator)
                           slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_3d4);
              }
              else {
                *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3d4;
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_260.format_ = local_row.format_;
              local_260.num_col_ = local_row.num_col_;
              local_260.num_row_ = local_row.num_row_;
              std::vector<int,_std::allocator<int>_>::vector(&local_260.start_,&local_row.start_);
              std::vector<int,_std::allocator<int>_>::vector(&local_260.p_end_,&local_row.p_end_);
              std::vector<int,_std::allocator<int>_>::vector(&local_260.index_,&local_row.index_);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_260.value_,&local_row.value_);
              HighsSparseMatrix::addRows(local_3d0,&local_260,(int8_t *)0x0);
              if (local_260.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_260.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.index_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_260.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_260.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              local_378 = (ulong)((int)local_378 + 1);
              iVar9._M_current =
                   (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              dVar19 = upper;
              if (iVar9._M_current !=
                  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0022ea6a;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_3c8,iVar9,&upper);
            }
            else {
              local_3d4 = ~(uint)((ulong)((long)(this->standard_form_rhs_).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->standard_form_rhs_).
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3);
              if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&slack_ix,
                           (iterator)
                           slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_3d4);
              }
              else {
                *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3d4;
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              HighsSparseMatrix::getRow
                        (local_3c0,iRow,pHVar12,
                         local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_row.value_.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              local_180.num_row_ = local_row.num_row_;
              local_180.format_ = local_row.format_;
              local_180.num_col_ = local_row.num_col_;
              std::vector<int,_std::allocator<int>_>::vector(&local_180.start_,&local_row.start_);
              std::vector<int,_std::allocator<int>_>::vector(&local_180.p_end_,&local_row.p_end_);
              std::vector<int,_std::allocator<int>_>::vector(&local_180.index_,&local_row.index_);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_180.value_,&local_row.value_);
              HighsSparseMatrix::addRows(local_3d0,&local_180,(int8_t *)0x0);
              if (local_180.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_180.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.index_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_180.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_180.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar17 = (ulong)((int)uVar17 + 1);
              iVar9._M_current =
                   (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              dVar19 = lower;
              if (iVar9._M_current ==
                  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_3c8,iVar9,&lower);
              }
              else {
LAB_0022ea6a:
                *iVar9._M_current = dVar19;
                (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
              }
            }
          }
          else {
            local_3d4 = (int)((ulong)((long)(this->standard_form_rhs_).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->standard_form_rhs_).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
            if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&slack_ix,
                         (iterator)
                         slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_3d4);
            }
            else {
              *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_3d4;
              slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            HighsSparseMatrix::getRow
                      (local_3c0,iRow,pHVar12,
                       local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
            local_110.num_row_ = local_row.num_row_;
            local_110.format_ = local_row.format_;
            local_110.num_col_ = local_row.num_col_;
            std::vector<int,_std::allocator<int>_>::vector(&local_110.start_,&local_row.start_);
            std::vector<int,_std::allocator<int>_>::vector(&local_110.p_end_,&local_row.p_end_);
            std::vector<int,_std::allocator<int>_>::vector(&local_110.index_,&local_row.index_);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_110.value_,&local_row.value_);
            HighsSparseMatrix::addRows(local_3d0,&local_110,(int8_t *)0x0);
            if (local_110.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.value_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_110.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
            }
            if (local_110.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
            }
            if (local_110.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
            }
            uVar15 = (ulong)((int)uVar15 + 1);
            iVar9._M_current =
                 (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            dVar19 = upper;
            if (iVar9._M_current !=
                (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0022ea6a;
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_3c8,iVar9,&upper);
          }
        }
        else {
          HighsSparseMatrix::getRow
                    (local_3c0,iRow,pHVar12,
                     local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          local_a0.num_row_ = local_row.num_row_;
          local_a0.format_ = local_row.format_;
          local_a0.num_col_ = local_row.num_col_;
          std::vector<int,_std::allocator<int>_>::vector(&local_a0.start_,&local_row.start_);
          std::vector<int,_std::allocator<int>_>::vector(&local_a0.p_end_,&local_row.p_end_);
          std::vector<int,_std::allocator<int>_>::vector(&local_a0.index_,&local_row.index_);
          std::vector<double,_std::allocator<double>_>::vector(&local_a0.value_,&local_row.value_);
          HighsSparseMatrix::addRows(local_3d0,&local_a0,(int8_t *)0x0);
          if (local_a0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.value_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_a0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_a0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          local_370 = (ulong)((int)local_370 + 1);
          iVar9._M_current =
               (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          dVar19 = upper;
          if (iVar9._M_current !=
              (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) goto LAB_0022ea6a;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_3c8,iVar9,&upper);
        }
      }
      else {
        uVar16 = (ulong)((int)uVar16 + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->model_).lp_.num_row_);
  }
  if (0 < (this->model_).lp_.num_col_) {
    local_3c8 = (vector<double,std::allocator<double>> *)&this->standard_form_cost_;
    lVar11 = 0;
    do {
      lower = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      if (((this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start[lVar11] != -INFINITY) && (lower != INFINITY)) {
        upper = 0.0;
        iVar9._M_current =
             (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_3c8,iVar9,&upper);
        }
        else {
          *iVar9._M_current = 0.0;
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        pHVar12 = &(this->standard_form_matrix_).num_col_;
        *pHVar12 = *pHVar12 + 1;
        local_2d0.num_col_ = local_row.num_col_ + 1;
        local_row.num_col_ = local_2d0.num_col_;
        *local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = (int)lVar11;
        local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = (this->standard_form_matrix_).num_col_ + -1;
        *local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 1.0;
        local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[1] = 1.0;
        local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = 2;
        local_2d0.num_row_ = local_row.num_row_;
        local_2d0.format_ = local_row.format_;
        std::vector<int,_std::allocator<int>_>::vector(&local_2d0.start_,&local_row.start_);
        std::vector<int,_std::allocator<int>_>::vector(&local_2d0.p_end_,&local_row.p_end_);
        std::vector<int,_std::allocator<int>_>::vector(&local_2d0.index_,&local_row.index_);
        std::vector<double,_std::allocator<double>_>::vector(&local_2d0.value_,&local_row.value_);
        HighsSparseMatrix::addRows(local_3d0,&local_2d0,(int8_t *)0x0);
        if (local_2d0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.value_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2d0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_2d0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_2d0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar9._M_current =
             (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&this->standard_form_rhs_,iVar9,&lower
                    );
        }
        else {
          *iVar9._M_current = lower;
          (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->model_).lp_.num_col_);
  }
  HighsSparseMatrix::ensureColwise(local_3c0);
  HighsSparseMatrix::ensureColwise(local_3d0);
  if ((this->model_).lp_.num_col_ < 1) {
    uVar10 = 0;
    uVar18 = 0;
    local_3b8 = 0;
    local_3b4 = 0;
    local_384 = 0;
  }
  else {
    local_3c8 = (vector<double,std::allocator<double>> *)&this->standard_form_cost_;
    this_00 = &(this->standard_form_matrix_).start_;
    local_3d0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).index_;
    local_3c0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).value_;
    lVar11 = 0;
    local_384 = 0;
    local_3b4 = 0;
    local_3b8 = 0;
    uVar18 = 0;
    uVar10 = 0;
    do {
      dVar20 = (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11] * dVar21;
      dVar19 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      if (dVar19 == -INFINITY) {
        if (dVar1 == INFINITY) {
          lower = -dVar20;
          iVar9._M_current =
               (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)local_3c8,iVar9,&lower);
          }
          else {
            *iVar9._M_current = lower;
            (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = piVar3[lVar11];
          lVar8 = (long)iVar7;
          if (iVar7 < piVar3[lVar11 + 1]) {
            lVar13 = lVar8 * 4;
            do {
              __args = (int *)((long)(this->standard_form_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar13);
              iVar6._M_current =
                   (this->standard_form_matrix_).index_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar6._M_current ==
                  (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_3d0,iVar6,__args);
              }
              else {
                *iVar6._M_current = *__args;
                (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              lower = -*(double *)
                        ((long)(this->standard_form_matrix_).value_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar13 * 2);
              iVar9._M_current =
                   (this->standard_form_matrix_).value_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (this->standard_form_matrix_).value_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)local_3c0,iVar9,&lower);
              }
              else {
                *iVar9._M_current = lower;
                (this->standard_form_matrix_).value_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar9._M_current + 1;
              }
              lVar8 = lVar8 + 1;
              lVar13 = lVar13 + 4;
            } while (lVar8 < (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar11 + 1]);
          }
          iVar7 = (int)((ulong)((long)(this->standard_form_matrix_).index_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->standard_form_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2);
          lower = (double)CONCAT44(lower._4_4_,iVar7);
          iVar6._M_current =
               (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (this_00,iVar6,(int *)&lower);
          }
          else {
            *iVar6._M_current = iVar7;
            (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          local_384 = local_384 + 1;
        }
        else {
          local_3b4 = local_3b4 + 1;
          this->standard_form_offset_ = dVar20 * dVar1 + this->standard_form_offset_;
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = -dVar20;
          piVar3 = (this->standard_form_matrix_).start_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar7 = piVar3[lVar11];
          lVar8 = (long)iVar7;
          iVar2 = piVar3[lVar11 + 1];
          if (iVar7 < iVar2) {
            pdVar4 = (this->standard_form_matrix_).value_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar3 = (this->standard_form_matrix_).index_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            do {
              iVar7 = piVar3[lVar8];
              pdVar5[iVar7] = pdVar5[iVar7] - pdVar4[lVar8] * dVar1;
              pdVar4[lVar8] = -pdVar4[lVar8];
              lVar8 = lVar8 + 1;
            } while (iVar2 != lVar8);
          }
        }
      }
      else {
        if (dVar1 == INFINITY) {
          local_3b8 = local_3b8 + 1;
        }
        else if ((dVar19 != dVar1) || (NAN(dVar19) || NAN(dVar1))) {
          uVar18 = (ulong)((int)uVar18 + 1);
        }
        else {
          uVar10 = (ulong)((int)uVar10 + 1);
        }
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          this->standard_form_offset_ = dVar20 * dVar19 + this->standard_form_offset_;
          piVar3 = (this->standard_form_matrix_).start_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar7 = piVar3[lVar11];
          lVar8 = (long)iVar7;
          iVar2 = piVar3[lVar11 + 1];
          if (iVar7 < iVar2) {
            pdVar4 = (this->standard_form_matrix_).value_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar3 = (this->standard_form_matrix_).index_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            do {
              iVar7 = piVar3[lVar8];
              pdVar5[iVar7] = pdVar5[iVar7] - pdVar4[lVar8] * dVar19;
              lVar8 = lVar8 + 1;
            } while (iVar2 != lVar8);
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->model_).lp_.num_col_);
  }
  if (0 < (int)((ulong)((long)slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    local_3d0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).index_;
    local_3c0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).value_;
    local_3c8 = (vector<double,std::allocator<double>> *)&(this->standard_form_matrix_).start_;
    lVar11 = 0;
    do {
      uVar14 = slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      lower = 0.0;
      iVar9._M_current =
           (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->standard_form_cost_,iVar9,&lower);
      }
      else {
        *iVar9._M_current = 0.0;
        (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      if ((int)uVar14 < 1) {
        lower = (double)CONCAT44(lower._4_4_,~uVar14);
        iVar6._M_current =
             (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_3d0,iVar6,(int *)&lower);
        }
        else {
          *iVar6._M_current = ~uVar14;
          (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        lower = -1.0;
        iVar9._M_current =
             (this->standard_form_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar9._M_current !=
            (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *iVar9._M_current = -1.0;
          goto LAB_0022f5a4;
        }
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_3c0,iVar9,&lower);
      }
      else {
        lower = (double)CONCAT44(lower._4_4_,uVar14 - 1);
        iVar6._M_current =
             (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_3d0,iVar6,(int *)&lower);
        }
        else {
          *iVar6._M_current = uVar14 - 1;
          (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        lower = 1.0;
        iVar9._M_current =
             (this->standard_form_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar9._M_current ==
            (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_3c0,iVar9,&lower);
        }
        else {
          *iVar9._M_current = 1.0;
LAB_0022f5a4:
          (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
      }
      iVar7 = (int)((ulong)((long)(this->standard_form_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->standard_form_matrix_).index_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      lower = (double)CONCAT44(lower._4_4_,iVar7);
      iVar6._M_current =
           (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_3c8,iVar6,(int *)&lower);
      }
      else {
        *iVar6._M_current = iVar7;
        (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)slack_ix.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)slack_ix.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  this->standard_form_valid_ = true;
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / boxed / fixed) variables (%d / %d / %d / %d / %d) and constraints (%d / %d / %d / %d / %d) \n"
               ,(ulong)local_384,(ulong)local_3b8,(ulong)local_3b4,uVar18,uVar10,uVar16,uVar17,
               uVar15,local_378,local_370);
  if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_row.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::formStandardFormLp() {
  this->clearStandardFormLp();
  HighsLp& lp = this->model_.lp_;
  HighsSparseMatrix& matrix = lp.a_matrix_;
  // Ensure that the incumbent LP and standard form LP matrices are rowwise
  matrix.ensureRowwise();
  // Original rows are processed before columns, so that any original
  // boxed rows can be transformed to pairs of one-sided rows,
  // requiring the standard form matrix to be row-wise. The original
  // columns are assumed to come before any new columns, so their
  // costs (as a minimization) must be defined befor costs of new
  // columns.
  // Determine the objective scaling, and apply it to any offset
  HighsInt sense = HighsInt(lp.sense_);
  this->standard_form_offset_ = sense * lp.offset_;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    this->standard_form_cost_.push_back(sense * lp.col_cost_[iCol]);
  this->standard_form_matrix_.format_ = MatrixFormat::kRowwise;
  this->standard_form_matrix_.num_col_ = lp.num_col_;
  // Create a HighsSparseMatrix instance to store rows extracted from
  // the original constraint matrix
  HighsInt local_row_min_nnz = std::max(lp.num_col_, HighsInt(2));
  HighsSparseMatrix local_row;
  local_row.ensureRowwise();
  local_row.num_row_ = 1;
  local_row.num_col_ = lp.num_col_;
  local_row.index_.resize(local_row_min_nnz);
  local_row.value_.resize(local_row_min_nnz);
  local_row.start_.resize(2);
  HighsInt& num_nz = local_row.start_[1];
  local_row.start_[0] = 0;
  HighsInt num_fixed_row = 0;
  HighsInt num_boxed_row = 0;
  HighsInt num_lower_row = 0;
  HighsInt num_upper_row = 0;
  HighsInt num_free_row = 0;
  HighsInt num_fixed_col = 0;
  HighsInt num_boxed_col = 0;
  HighsInt num_lower_col = 0;
  HighsInt num_upper_col = 0;
  HighsInt num_free_col = 0;
  std::vector<HighsInt> slack_ix;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double lower = lp.row_lower_[iRow];
    double upper = lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      assert(0 == 1);
      // Free row
      num_free_row++;
      continue;
    }
    if (lower == upper) {
      // Equality row
      num_fixed_row++;
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
      continue;
    } else if (lower <= -kHighsInf) {
      // Upper bounded row, so record the slack
      num_upper_row++;
      assert(upper < kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    } else if (upper >= kHighsInf) {
      // Lower bounded row, so record the slack
      num_lower_row++;
      assert(lower > -kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
    } else {
      // Boxed row, so record the lower slack
      assert(lower > -kHighsInf);
      assert(upper < kHighsInf);
      num_boxed_row++;
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
      // .. and upper slack, adding a copy of the row
      standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Add rows corresponding to boxed columns
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf && upper < kHighsInf) {
      // Boxed column
      //
      // x will be replaced by x = l + X (below) with X >= 0
      //
      // Introduce variable s >= 0 so that (with x >= l still)
      //
      // x = u - s => x + s = u
      this->standard_form_cost_.push_back(0);
      this->standard_form_matrix_.num_col_++;
      local_row.num_col_++;
      local_row.index_[0] = iCol;
      local_row.index_[1] = this->standard_form_matrix_.num_col_ - 1;
      local_row.value_[0] = 1;
      local_row.value_[1] = 1;
      local_row.start_[1] = 2;
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Finished with both matrices, row-wise, so ensure that the
  // incumbent matrix leaves col-wise, and that the standard form
  // matrix is col-wise so RHS shifts can be applied and more columns
  // can be added
  matrix.ensureColwise();
  this->standard_form_matrix_.ensureColwise();
  // Work through the columns, ensuring that all have non-negativity bounds
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = sense * lp.col_cost_[iCol];
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf) {
      // Finite lower bound
      if (upper < kHighsInf) {
        if (lower == upper) {
          // Fixed column
          num_fixed_col++;
        } else {
          // Boxed column
          num_boxed_col++;
        }
      } else {
        // Lower column
        num_lower_col++;
      }
      if (lower != 0) {
        // x >= l, so shift x-l = X >= 0, giving x = X + l
        //
        // Cost contribution c(X+l) = cX + cl
        this->standard_form_offset_ += cost * lower;
        // Constraint contribution a(X+l) = aX + al
        for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
             iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++)
          this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
              this->standard_form_matrix_.value_[iEl] * lower;
      }
    } else if (upper < kHighsInf) {
      // Upper column
      num_upper_col++;
      // Have to operate even if u=0, since cost and column values are negated
      //
      // x <= u, so shift u-x = X >= 0, giving x = u - X
      //
      // Cost contribution c(u-X) = cu - cX
      this->standard_form_offset_ += cost * upper;
      this->standard_form_cost_[iCol] = -cost;
      // Constraint contribution a(u-X) = -aX + au
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
            this->standard_form_matrix_.value_[iEl] * upper;
        this->standard_form_matrix_.value_[iEl] =
            -this->standard_form_matrix_.value_[iEl];
      }
    } else {
      // Free column
      num_free_col++;
      // Represent as x = x+ - x-
      //
      // where original column is now x+ >= 0
      //
      // and x- >= 0 has negation of its cost and matrix column
      this->standard_form_cost_.push_back(-cost);
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_matrix_.index_.push_back(
            this->standard_form_matrix_.index_[iEl]);
        this->standard_form_matrix_.value_.push_back(
            -this->standard_form_matrix_.value_[iEl]);
      }
      this->standard_form_matrix_.start_.push_back(
          HighsInt(this->standard_form_matrix_.index_.size()));
    }
  }
  // Now add the slack variables
  for (HighsInt iX = 0; iX < HighsInt(slack_ix.size()); iX++) {
    HighsInt iRow = slack_ix[iX];
    this->standard_form_cost_.push_back(0);
    if (iRow > 0) {
      this->standard_form_matrix_.index_.push_back(iRow - 1);
      this->standard_form_matrix_.value_.push_back(1);
    } else {
      this->standard_form_matrix_.index_.push_back(-iRow - 1);
      this->standard_form_matrix_.value_.push_back(-1);
    }
    this->standard_form_matrix_.start_.push_back(
        HighsInt(this->standard_form_matrix_.index_.size()));
  }
  this->standard_form_valid_ = true;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / "
               "boxed / fixed) variables"
               " (%d / %d / %d / %d / %d) and constraints"
               " (%d / %d / %d / %d / %d) \n",
               int(num_free_col), int(num_lower_col), int(num_upper_col),
               int(num_boxed_col), int(num_fixed_col), int(num_free_row),
               int(num_lower_row), int(num_upper_row), int(num_boxed_row),
               int(num_fixed_row));
  return HighsStatus::kOk;
}